

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void Qiniu_Region_Set_Rs_Alternative_Hosts
               (Qiniu_Region *region,char **hosts,size_t hostsCount,Qiniu_Bool useHttps)

{
  _Qiniu_Region_Service *p_Var1;
  _Qiniu_Region_Service *p_Var2;
  
  if (region != (Qiniu_Region *)0x0) {
    p_Var2 = region->rsService;
    if (p_Var2 != (_Qiniu_Region_Service *)0x0) {
      p_Var1 = _Qiniu_Region_Service_New
                         (p_Var2->hosts,p_Var2->acceleratedHostsCount,
                          p_Var2->hosts + p_Var2->acceleratedHostsCount,p_Var2->preferredHostsCount,
                          hosts,hostsCount,useHttps);
      region->rsService = p_Var1;
      _Qiniu_Region_Service_Free(p_Var2);
      return;
    }
    p_Var2 = _Qiniu_Region_Service_New((char **)0x0,0,(char **)0x0,0,hosts,hostsCount,useHttps);
    region->rsService = p_Var2;
  }
  return;
}

Assistant:

void Qiniu_Region_Set_Rs_Alternative_Hosts(Qiniu_Region *region, const char *const *hosts, size_t hostsCount, Qiniu_Bool useHttps)
{
    if (region == NULL)
    {
        return;
    }
    if (region->rsService != NULL)
    {
        struct _Qiniu_Region_Service *oldRsService = region->rsService;
        region->rsService = _Qiniu_Region_Service_New(
            oldRsService->hosts, oldRsService->acceleratedHostsCount,
            oldRsService->hosts + oldRsService->acceleratedHostsCount, oldRsService->preferredHostsCount,
            hosts, hostsCount,
            useHttps);
        _Qiniu_Region_Service_Free(oldRsService);
    }
    else
    {
        region->rsService = _Qiniu_Region_Service_New(NULL, 0, NULL, 0, hosts, hostsCount, useHttps);
    }
}